

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniq_vector.h
# Opt level: O0

size_t __thiscall
re2c::uniq_vector_t<const_re2c::State_*>::find_or_add
          (uniq_vector_t<const_re2c::State_*> *this,State **v)

{
  size_type sVar1;
  reference ppSVar2;
  ulong local_30;
  size_t i;
  size_t size;
  State **v_local;
  uniq_vector_t<const_re2c::State_*> *this_local;
  
  sVar1 = std::vector<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>::size(&this->elems)
  ;
  local_30 = 0;
  while( true ) {
    if (sVar1 <= local_30) {
      std::vector<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>::push_back
                (&this->elems,v);
      return sVar1;
    }
    ppSVar2 = std::vector<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>::operator[]
                        (&this->elems,local_30);
    if (*ppSVar2 == *v) break;
    local_30 = local_30 + 1;
  }
  return local_30;
}

Assistant:

size_t find_or_add (const value_t & v)
	{
		const size_t size = elems.size ();
		for (size_t i = 0; i < size; ++i)
		{
			if (elems[i] == v)
			{
				return i;
			}
		}
		elems.push_back (v);
		return size;
	}